

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

xml_node<char> * __thiscall ki::dml::Record::as_xml(Record *this,xml_document<char> *doc)

{
  const_iterator this_00;
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  undefined4 extraout_var;
  __normal_iterator<ki::dml::FieldBase_*const_*,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_30;
  __normal_iterator<ki::dml::FieldBase_*const_*,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  local_28;
  const_iterator it;
  xml_node<char> *node;
  xml_document<char> *doc_local;
  Record *this_local;
  
  it._M_current =
       (FieldBase **)
       rapidxml::memory_pool<char>::allocate_node
                 (&doc->super_memory_pool<char>,node_element,"RECORD",(char *)0x0,0,0);
  local_28._M_current =
       (FieldBase **)
       std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::begin
                 (&this->m_fields);
  while( true ) {
    local_30._M_current =
         (FieldBase **)
         std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::end
                   (&this->m_fields);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    this_00 = it;
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<ki::dml::FieldBase_*const_*,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
              ::operator*(&local_28);
    iVar2 = (*((*ppFVar3)->super_Serializable)._vptr_Serializable[6])(*ppFVar3,doc);
    rapidxml::xml_node<char>::append_node
              ((xml_node<char> *)this_00._M_current,(xml_node<char> *)CONCAT44(extraout_var,iVar2));
    __gnu_cxx::
    __normal_iterator<ki::dml::FieldBase_*const_*,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
    ::operator++(&local_28);
  }
  return (xml_node<char> *)it._M_current;
}

Assistant:

rapidxml::xml_node<> *Record::as_xml(rapidxml::xml_document<> &doc) const
	{
		auto *node = doc.allocate_node(rapidxml::node_type::node_element, "RECORD");
		for (auto it = m_fields.begin(); it != m_fields.end(); ++it)
			node->append_node((*it)->as_xml(doc));
		return node;
	}